

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O3

void Lpk_NodeRecordImpact(Lpk_Man_t *p)

{
  uint *puVar1;
  size_t __size;
  uint *puVar2;
  Vec_Ptr_t *pVVar3;
  uint uVar4;
  void *pvVar5;
  void *pvVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  int *piVar10;
  ulong uVar11;
  
  iVar8 = p->pObj->Id;
  if (((long)iVar8 < 0) || (p->vVisited->nSize <= iVar8)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                  ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
  }
  puVar2 = (uint *)p->vVisited->pArray[iVar8];
  puVar2[1] = 0;
  iVar8 = p->nCuts;
  if (0 < iVar8) {
    piVar10 = p->pCuts[0].pLeaves;
    uVar7 = 0;
    lVar9 = 0;
    do {
      uVar4 = *(uint *)(p->pCuts + lVar9);
      if ((uVar4 & 0x3f) != 0) {
        uVar11 = 0;
        do {
          iVar8 = piVar10[uVar11];
          if (((long)iVar8 < 0) || (pVVar3 = p->pNtk->vObjs, pVVar3->nSize <= iVar8))
          goto LAB_00475063;
          pvVar6 = pVVar3->pArray[iVar8];
          if ((*(uint *)((long)pvVar6 + 0x14) & 0x40) == 0) {
            *(uint *)((long)pvVar6 + 0x14) = *(uint *)((long)pvVar6 + 0x14) | 0x40;
            iVar8 = *(int *)((long)pvVar6 + 0x10);
            uVar7 = *puVar2;
            uVar4 = puVar2[1];
            if (uVar4 == uVar7) {
              if ((int)uVar4 < 0x10) {
                if (*(void **)(puVar2 + 2) == (void *)0x0) {
                  pvVar5 = malloc(0x80);
                }
                else {
                  pvVar5 = realloc(*(void **)(puVar2 + 2),0x80);
                }
                uVar7 = 0x10;
              }
              else {
                uVar7 = uVar4 * 2;
                if (*(void **)(puVar2 + 2) == (void *)0x0) {
                  pvVar5 = malloc((ulong)uVar4 << 4);
                }
                else {
                  pvVar5 = realloc(*(void **)(puVar2 + 2),(ulong)uVar4 << 4);
                }
              }
              *(void **)(puVar2 + 2) = pvVar5;
              *puVar2 = uVar7;
              uVar4 = puVar2[1];
            }
            else {
              pvVar5 = *(void **)(puVar2 + 2);
            }
            puVar2[1] = uVar4 + 1;
            *(long *)((long)pvVar5 + (long)(int)uVar4 * 8) = (long)iVar8;
            iVar8 = *(int *)((long)pvVar6 + 0x2c);
            if (uVar4 + 1 == uVar7) {
              if ((int)uVar4 < 0xf) {
                if (*(void **)(puVar2 + 2) == (void *)0x0) {
                  pvVar6 = malloc(0x80);
                }
                else {
                  pvVar6 = realloc(*(void **)(puVar2 + 2),0x80);
                }
                *(void **)(puVar2 + 2) = pvVar6;
                *puVar2 = 0x10;
              }
              else {
                __size = (ulong)(uVar7 * 2) * 8;
                if (*(void **)(puVar2 + 2) == (void *)0x0) {
                  pvVar6 = malloc(__size);
                }
                else {
                  pvVar6 = realloc(*(void **)(puVar2 + 2),__size);
                }
                *(void **)(puVar2 + 2) = pvVar6;
                *puVar2 = uVar7 * 2;
              }
            }
            else {
              pvVar6 = *(void **)(puVar2 + 2);
            }
            uVar4 = puVar2[1];
            uVar7 = uVar4 + 1;
            puVar2[1] = uVar7;
            *(long *)((long)pvVar6 + (long)(int)uVar4 * 8) = (long)iVar8;
            uVar4 = *(uint *)(p->pCuts + lVar9);
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < (uVar4 & 0x3f));
        iVar8 = p->nCuts;
      }
      lVar9 = lVar9 + 1;
      piVar10 = piVar10 + 0x35;
    } while (lVar9 < iVar8);
    if (0 < (int)uVar7) {
      lVar9 = 0;
      do {
        uVar7 = (uint)*(undefined8 *)(*(long *)(puVar2 + 2) + lVar9 * 8);
        if (((int)uVar7 < 0) || (pVVar3 = p->pNtk->vObjs, pVVar3->nSize <= (int)uVar7)) {
LAB_00475063:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        puVar1 = (uint *)((long)pVVar3->pArray[uVar7 & 0x7fffffff] + 0x14);
        *puVar1 = *puVar1 & 0xffffffbf;
        lVar9 = lVar9 + 2;
      } while ((int)lVar9 < (int)puVar2[1]);
    }
  }
  return;
}

Assistant:

void Lpk_NodeRecordImpact( Lpk_Man_t * p )
{
    Lpk_Cut_t * pCut;
    Vec_Ptr_t * vNodes = Vec_VecEntry( p->vVisited, p->pObj->Id );
    Abc_Obj_t * pNode;
    int i, k;
    // collect the nodes that impact the given node
    Vec_PtrClear( vNodes );
    for ( i = 0; i < p->nCuts; i++ )
    {
        pCut = p->pCuts + i;
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
        {
            pNode = Abc_NtkObj( p->pNtk, pCut->pLeaves[k] );
            if ( pNode->fMarkC )
                continue;
            pNode->fMarkC = 1;
            Vec_PtrPush( vNodes, (void *)(ABC_PTRUINT_T)pNode->Id );
            Vec_PtrPush( vNodes, (void *)(ABC_PTRUINT_T)Abc_ObjFanoutNum(pNode) );
        }
    }
    // clear the marks
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        pNode = Abc_NtkObj( p->pNtk, (int)(ABC_PTRUINT_T)pNode );
        pNode->fMarkC = 0;
        i++;
    }
//printf( "%d ", Vec_PtrSize(vNodes) );
}